

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O2

__pid_t __thiscall kmp_flag_oncore::wait(kmp_flag_oncore *this,void *__stat_loc)

{
  kmp_int32 gtid;
  int iVar1;
  unsigned_long_long *puVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  __pid_t _Var6;
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  int in_EDX;
  kmp_uint32 kVar10;
  int iVar11;
  int local_44;
  void *local_40;
  ulong local_38;
  
  puVar2 = (this->super_kmp_flag<unsigned_long_long>).loc;
  local_40 = this->itt_sync_obj;
  local_44 = 0;
  bVar5 = done_check(this);
  kVar10 = __kmp_yield_init;
  if (bVar5) {
    puVar9 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay < 1) {
      _Var6 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar2);
      return _Var6;
    }
  }
  else {
    gtid = *(kmp_int32 *)((long)__stat_loc + 0x24);
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      lVar7 = __kmp_hardware_timestamp();
      local_38 = lVar7 + *(long *)((long)__stat_loc + 0x88);
    }
    iVar4 = __kmp_nth;
    iVar3 = __kmp_avail_proc;
    iVar11 = 0;
LAB_0013d399:
    bVar5 = notdone_check(this);
    if (bVar5) {
      if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0013d3fe:
        lVar7 = 0;
      }
      else {
        lVar7 = *(long *)((long)__stat_loc + 0x170);
        if (lVar7 == 0) {
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
          goto LAB_0013d3fe;
        }
        if (*(int *)(lVar7 + 0xc0) == 0) {
          *(undefined8 *)((long)__stat_loc + 0x170) = 0;
LAB_0013d40a:
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
        }
        else {
          if (*(int *)(lVar7 + 0x50) != 1) goto LAB_0013d40a;
          __kmp_execute_tasks_oncore((kmp_info_t *)__stat_loc,gtid,this,in_EDX,&local_44,local_40,0)
          ;
        }
      }
      if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
        if (iVar11 < __kmp_itt_prepare_delay) {
          iVar11 = iVar11 + 1;
          if (__kmp_itt_prepare_delay <= iVar11) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar2);
          }
        }
      }
      if (__kmp_global.g.g_done == 0) goto code_r0x0013d454;
      goto LAB_0013d52f;
    }
LAB_0013d541:
    puVar9 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar11)
    {
      puVar9 = (undefined1 *)(*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar2);
    }
  }
  return (__pid_t)puVar9;
code_r0x0013d454:
  if (iVar3 < iVar4) {
    __kmp_yield(1);
  }
  else {
    kVar10 = kVar10 - 2;
    if (kVar10 == 0) {
      __kmp_yield(1);
      kVar10 = __kmp_yield_next;
    }
  }
  iVar1 = *(int *)((long)__stat_loc + 0x60);
  if ((*(char *)((long)__stat_loc + 0x19c) == '\0') == (iVar1 != 0)) {
    if (iVar1 == 0) {
      LOCK();
      __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
      UNLOCK();
    }
    else {
      LOCK();
      __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
      UNLOCK();
    }
    *(bool *)((long)__stat_loc + 0x19c) = iVar1 != 0;
  }
  if ((__kmp_dflt_blocktime != 0x7fffffff) && ((lVar7 == 0 || (*(int *)(lVar7 + 0x50) == 0)))) {
    uVar8 = __kmp_hardware_timestamp();
    if (local_38 <= uVar8) {
      __kmp_suspend_oncore(gtid,this);
      if (__kmp_global.g.g_done != 0) {
LAB_0013d52f:
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
        goto LAB_0013d541;
      }
      if ((__kmp_tasking_mode != tskm_immediate_exec) && (*(int *)((long)__stat_loc + 0x198) == 1))
      {
        *(undefined4 *)((long)__stat_loc + 0x198) = 0;
      }
    }
  }
  goto LAB_0013d399;
}

Assistant:

void wait(kmp_info_t *this_thr, int final_spin) {
    __kmp_wait_template<kmp_flag_oncore>(
        this_thr, this, final_spin USE_ITT_BUILD_ARG(itt_sync_obj));
  }